

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

void __thiscall
Assimp::BlenderImporter::ConvertBlendFile
          (BlenderImporter *this,aiScene *out,Scene *in,FileDatabase *file)

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  undefined8 uVar4;
  aiScene *paVar5;
  pointer ppaVar6;
  pointer ppaVar7;
  pointer ppaVar8;
  pointer ppaVar9;
  pointer ppaVar10;
  uint uVar11;
  element_type *peVar12;
  element_type *peVar13;
  aiNode *this_00;
  aiNode **__s;
  long lVar14;
  aiNode *paVar15;
  aiMesh **__dest;
  aiLight **__dest_00;
  aiCamera **__dest_01;
  aiMaterial **__dest_02;
  aiTexture **__dest_03;
  Object **ppOVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  shared_ptr<Assimp::Blender::Base> cur;
  deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
  no_parents;
  ConversionData conv;
  element_type *local_230;
  undefined1 local_228 [12];
  float fStack_21c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_218;
  undefined8 uStack_208;
  float local_200;
  undefined8 local_1fc;
  undefined8 uStack_1f4;
  float local_1ec;
  aiScene *local_1e8;
  BlenderImporter *local_1e0;
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
  local_1d8;
  ConversionData local_180;
  
  local_1e0 = this;
  Blender::ConversionData::ConversionData(&local_180,file);
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  _M_initialize_map(&local_1d8,0);
  peVar12 = (in->base).first.
            super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_228._0_4_ = SUB84(peVar12,0);
  local_228._4_4_ = (undefined4)((ulong)peVar12 >> 0x20);
  p_Var2 = (in->base).first.
           super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  local_228._8_4_ = SUB84(p_Var2,0);
  fStack_21c = (float)((ulong)p_Var2 >> 0x20);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_1e8 = out;
  if (peVar12 != (element_type *)0x0) {
    do {
      peVar3 = (element_type *)peVar12[2].dna_type;
      if (peVar3 != (element_type *)0x0) {
        local_230 = peVar3;
        if (peVar3->parent == (Object *)0x0) {
          std::deque<Assimp::Blender::Object_const*,std::allocator<Assimp::Blender::Object_const*>>
          ::emplace_back<Assimp::Blender::Object_const*>
                    ((deque<Assimp::Blender::Object_const*,std::allocator<Assimp::Blender::Object_const*>>
                      *)&local_1d8,&local_230);
        }
        else {
          std::
          _Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
          ::_M_insert_unique<Assimp::Blender::Object_const*>
                    ((_Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
                      *)&local_180,&local_230);
        }
      }
      lVar19 = CONCAT44(local_228._4_4_,local_228._0_4_);
      uVar4 = *(undefined8 *)(lVar19 + 0x18);
      local_228._0_4_ = (undefined4)uVar4;
      local_228._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar19 + 0x20));
      peVar12 = (element_type *)CONCAT44(local_228._4_4_,local_228._0_4_);
    } while (peVar12 != (element_type *)0x0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(fStack_21c,local_228._8_4_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(fStack_21c,local_228._8_4_))
    ;
  }
  paVar5 = local_1e8;
  peVar13 = (in->basact).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_228._0_4_ = SUB84(peVar13,0);
  local_228._4_4_ = (undefined4)((ulong)peVar13 >> 0x20);
  p_Var2 = (in->basact).super___shared_ptr<Assimp::Blender::Base,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  local_228._8_4_ = SUB84(p_Var2,0);
  fStack_21c = (float)((ulong)p_Var2 >> 0x20);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if (peVar13 != (element_type *)0x0) {
    do {
      peVar3 = (peVar13->object).
               super___shared_ptr<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) && (peVar3->parent != (Object *)0x0)) {
        local_230 = peVar3;
        std::
        _Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
        ::_M_insert_unique<Assimp::Blender::Object_const*>
                  ((_Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
                    *)&local_180,&local_230);
      }
      lVar19 = CONCAT44(local_228._4_4_,local_228._0_4_);
      uVar4 = *(undefined8 *)(lVar19 + 0x18);
      local_228._0_4_ = (undefined4)uVar4;
      local_228._4_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar19 + 0x20));
      peVar13 = (element_type *)CONCAT44(local_228._4_4_,local_228._0_4_);
    } while (peVar13 != (element_type *)0x0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(fStack_21c,local_228._8_4_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(fStack_21c,local_228._8_4_))
    ;
  }
  if (local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_228._0_8_ = &aStack_218;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_228,"Expected at least one object with no parent","");
    LogFunctions<Assimp::BlenderImporter>::ThrowException((string *)local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != &aStack_218) {
      operator_delete((void *)local_228._0_8_,
                      CONCAT44(aStack_218._M_allocated_capacity._4_4_,
                               aStack_218._M_allocated_capacity._0_4_) + 1);
    }
  }
  this_00 = (aiNode *)operator_new(0x478);
  local_228._0_8_ = &aStack_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"<BlenderRoot>","");
  aiNode::aiNode(this_00,(string *)local_228);
  paVar5->mRootNode = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._0_8_ != &aStack_218) {
    operator_delete((void *)local_228._0_8_,
                    CONCAT44(aStack_218._M_allocated_capacity._4_4_,
                             aStack_218._M_allocated_capacity._0_4_) + 1);
  }
  uVar11 = (int)((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           (int)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                 (long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((int)((ulong)((long)local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1
           + (uint)(local_1d8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
           ) * 0x40;
  this_00->mNumChildren = uVar11;
  uVar17 = (ulong)uVar11 << 3;
  __s = (aiNode **)operator_new__(uVar17);
  memset(__s,0,uVar17);
  this_00->mChildren = __s;
  if (this_00->mNumChildren != 0) {
    lVar19 = 0;
    uVar17 = 0;
    do {
      lVar14 = (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur -
               (long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_first >> 3;
      uVar1 = lVar14 + uVar17;
      if (uVar1 < 0x40) {
        ppOVar16 = (Object **)
                   ((long)local_1d8._M_impl.super__Deque_impl_data._M_start._M_cur + lVar19);
      }
      else {
        uVar18 = (uVar1 >> 6) + 0xfc00000000000000;
        if (0 < (long)uVar1) {
          uVar18 = uVar1 >> 6;
        }
        ppOVar16 = local_1d8._M_impl.super__Deque_impl_data._M_start._M_node[uVar18] +
                   lVar14 + uVar18 * -0x40 + uVar17;
      }
      local_228._0_4_ = 1.0;
      local_228._4_4_ = 0.0;
      local_228._8_4_ = 0.0;
      fStack_21c = 0.0;
      aStack_218._M_allocated_capacity._0_4_ = 0;
      aStack_218._M_allocated_capacity._4_4_ = 0x3f800000;
      aStack_218._8_8_ = 0;
      uStack_208._0_4_ = 0.0;
      uStack_208._4_4_ = 0.0;
      local_200 = 1.0;
      local_1fc._0_4_ = 0.0;
      local_1fc._4_4_ = 0.0;
      uStack_1f4._0_4_ = 0.0;
      uStack_1f4._4_4_ = 0.0;
      local_1ec = 1.0;
      paVar15 = ConvertNode(local_1e0,in,*ppOVar16,&local_180,(aiMatrix4x4 *)local_228);
      *(aiNode **)((long)this_00->mChildren + lVar19) = paVar15;
      *(aiNode **)(*(long *)((long)this_00->mChildren + lVar19) + 0x448) = this_00;
      uVar17 = uVar17 + 1;
      lVar19 = lVar19 + 8;
    } while (uVar17 < this_00->mNumChildren);
  }
  BuildMaterials(local_1e0,&local_180);
  ppaVar6 = local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  paVar5 = local_1e8;
  uVar17 = (long)local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (uVar17 != 0) {
    local_1e8->mNumMeshes = (uint)(uVar17 >> 3);
    __dest = (aiMesh **)operator_new__(uVar17 & 0x7fffffff8);
    paVar5->mMeshes = __dest;
    if (ppaVar6 !=
        local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      memmove(__dest,local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,uVar17);
      local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_180.meshes.arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  ppaVar8 = local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar17 = (long)local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (uVar17 != 0) {
    paVar5->mNumLights = (uint)(uVar17 >> 3);
    __dest_00 = (aiLight **)operator_new__(uVar17 & 0x7fffffff8);
    paVar5->mLights = __dest_00;
    if (ppaVar8 !=
        local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      memmove(__dest_00,
              local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl
              .super__Vector_impl_data._M_start,uVar17);
      local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_180.lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  ppaVar7 = local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar17 = (long)local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (uVar17 != 0) {
    paVar5->mNumCameras = (uint)(uVar17 >> 3);
    __dest_01 = (aiCamera **)operator_new__(uVar17 & 0x7fffffff8);
    paVar5->mCameras = __dest_01;
    if (ppaVar7 !=
        local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      memmove(__dest_01,
              local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
              _M_impl.super__Vector_impl_data._M_start,uVar17);
      local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_180.cameras.arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl
           .super__Vector_impl_data._M_start;
    }
  }
  ppaVar9 = local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar17 = (long)local_180.materials.arr.
                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_180.materials.arr.
                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar17 != 0) {
    paVar5->mNumMaterials = (uint)(uVar17 >> 3);
    __dest_02 = (aiMaterial **)operator_new__(uVar17 & 0x7fffffff8);
    paVar5->mMaterials = __dest_02;
    if (ppaVar9 !=
        local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      memmove(__dest_02,
              local_180.materials.arr.
              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_start,uVar17);
      local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_180.materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
  }
  ppaVar10 = local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  uVar17 = (long)local_180.textures.arr.
                 super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_180.textures.arr.
                 super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar17 != 0) {
    paVar5->mNumTextures = (uint)(uVar17 >> 3);
    __dest_03 = (aiTexture **)operator_new__(uVar17 & 0x7fffffff8);
    paVar5->mTextures = __dest_03;
    if (ppaVar10 !=
        local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl
        .super__Vector_impl_data._M_start) {
      memmove(__dest_03,
              local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
              _M_impl.super__Vector_impl_data._M_start,uVar17);
      local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_180.textures.arr.super__Vector_base<aiTexture_*,_std::allocator<aiTexture_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
  }
  if (paVar5->mNumMeshes == 0) {
    *(byte *)&paVar5->mFlags = (byte)paVar5->mFlags | 1;
  }
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  ~_Deque_base(&local_1d8);
  std::
  deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
  ::~deque(&local_180.materials_raw);
  Blender::TempArray<std::vector,_aiTexture>::~TempArray(&local_180.textures);
  Blender::TempArray<std::vector,_aiMaterial>::~TempArray(&local_180.materials);
  Blender::TempArray<std::vector,_aiLight>::~TempArray(&local_180.lights);
  Blender::TempArray<std::vector,_aiCamera>::~TempArray(&local_180.cameras);
  Blender::TempArray<std::vector,_aiMesh>::~TempArray(&local_180.meshes);
  std::
  _Rb_tree<const_Assimp::Blender::Object_*,_const_Assimp::Blender::Object_*,_std::_Identity<const_Assimp::Blender::Object_*>,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
  ::~_Rb_tree((_Rb_tree<const_Assimp::Blender::Object_*,_const_Assimp::Blender::Object_*,_std::_Identity<const_Assimp::Blender::Object_*>,_Assimp::Blender::ObjectCompare,_std::allocator<const_Assimp::Blender::Object_*>_>
               *)&local_180);
  return;
}

Assistant:

void BlenderImporter::ConvertBlendFile(aiScene* out, const Scene& in,const FileDatabase& file)
{
    ConversionData conv(file);

    // FIXME it must be possible to take the hierarchy directly from
    // the file. This is terrible. Here, we're first looking for
    // all objects which don't have parent objects at all -
    std::deque<const Object*> no_parents;
    for (std::shared_ptr<Base> cur = std::static_pointer_cast<Base> ( in.base.first ); cur; cur = cur->next) {
        if (cur->object) {
            if(!cur->object->parent) {
                no_parents.push_back(cur->object.get());
            } else {
                conv.objects.insert( cur->object.get() );
            }
        }
    }
    for (std::shared_ptr<Base> cur = in.basact; cur; cur = cur->next) {
        if (cur->object) {
            if(cur->object->parent) {
                conv.objects.insert(cur->object.get());
            }
        }
    }

    if (no_parents.empty()) {
        ThrowException("Expected at least one object with no parent");
    }

    aiNode* root = out->mRootNode = new aiNode("<BlenderRoot>");

    root->mNumChildren = static_cast<unsigned int>(no_parents.size());
    root->mChildren = new aiNode*[root->mNumChildren]();
    for (unsigned int i = 0; i < root->mNumChildren; ++i) {
        root->mChildren[i] = ConvertNode(in, no_parents[i], conv, aiMatrix4x4());
        root->mChildren[i]->mParent = root;
    }

    BuildMaterials(conv);

    if (conv.meshes->size()) {
        out->mMeshes = new aiMesh*[out->mNumMeshes = static_cast<unsigned int>( conv.meshes->size() )];
        std::copy(conv.meshes->begin(),conv.meshes->end(),out->mMeshes);
        conv.meshes.dismiss();
    }

    if (conv.lights->size()) {
        out->mLights = new aiLight*[out->mNumLights = static_cast<unsigned int>( conv.lights->size() )];
        std::copy(conv.lights->begin(),conv.lights->end(),out->mLights);
        conv.lights.dismiss();
    }

    if (conv.cameras->size()) {
        out->mCameras = new aiCamera*[out->mNumCameras = static_cast<unsigned int>( conv.cameras->size() )];
        std::copy(conv.cameras->begin(),conv.cameras->end(),out->mCameras);
        conv.cameras.dismiss();
    }

    if (conv.materials->size()) {
        out->mMaterials = new aiMaterial*[out->mNumMaterials = static_cast<unsigned int>( conv.materials->size() )];
        std::copy(conv.materials->begin(),conv.materials->end(),out->mMaterials);
        conv.materials.dismiss();
    }

    if (conv.textures->size()) {
        out->mTextures = new aiTexture*[out->mNumTextures = static_cast<unsigned int>( conv.textures->size() )];
        std::copy(conv.textures->begin(),conv.textures->end(),out->mTextures);
        conv.textures.dismiss();
    }

    // acknowledge that the scene might come out incomplete
    // by Assimp's definition of `complete`: blender scenes
    // can consist of thousands of cameras or lights with
    // not a single mesh between them.
    if (!out->mNumMeshes) {
        out->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }
}